

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O0

void visitElement(TransferElement *element,QColorVector *buffer,qsizetype len)

{
  bool bVar1;
  QColorTrc *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  qsizetype i;
  bool doW;
  undefined8 local_28;
  undefined4 in_stack_ffffffffffffffe4;
  float x;
  
  bVar1 = QColorTrc::isValid((QColorTrc *)(in_RDI + 0x150));
  x = (float)CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe4);
  for (local_28 = 0; local_28 < (long)in_RDX; local_28 = local_28 + 1) {
    fVar2 = QColorTrc::apply(in_RDX,x);
    *(float *)(in_RSI + local_28 * 0x10) = fVar2;
    fVar2 = QColorTrc::apply(in_RDX,x);
    *(float *)(in_RSI + local_28 * 0x10 + 4) = fVar2;
    fVar2 = QColorTrc::apply(in_RDX,x);
    *(float *)(in_RSI + local_28 * 0x10 + 8) = fVar2;
    if (((uint)x & 0x1000000) != 0) {
      fVar2 = QColorTrc::apply(in_RDX,x);
      *(float *)(in_RSI + local_28 * 0x10 + 0xc) = fVar2;
    }
  }
  return;
}

Assistant:

static void visitElement(const QColorSpacePrivate::TransferElement &element, QColorVector *buffer, const qsizetype len)
{
    const bool doW = element.trc[3].isValid();
    for (qsizetype i = 0; i < len; ++i) {
        buffer[i].x = element.trc[0].apply(buffer[i].x);
        buffer[i].y = element.trc[1].apply(buffer[i].y);
        buffer[i].z = element.trc[2].apply(buffer[i].z);
        if (doW)
            buffer[i].w = element.trc[3].apply(buffer[i].w);
    }
}